

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
Shell::runCommand(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,WASTCommand *cmd)

{
  add_pointer_t<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
  assn_00;
  type *assn;
  ActionResult local_78;
  add_pointer_t<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> local_38;
  type *act;
  type *reg;
  type *mod;
  WASTCommand *cmd_local;
  Shell *this_local;
  
  mod = (type *)cmd;
  cmd_local = (WASTCommand *)this;
  this_local = (Shell *)__return_storage_ptr__;
  reg = (type *)std::
                get_if<std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::WATParser::Register,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                          (cmd);
  if ((add_pointer_t<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>)
      reg == (add_pointer_t<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
              )0x0) {
    act = (type *)std::
                  get_if<wasm::WATParser::Register,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::WATParser::Register,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                            ((variant<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                              *)mod);
    if (act == (type *)0x0) {
      local_38 = std::
                 get_if<std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::WATParser::Register,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                           ((variant<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                             *)mod);
      if (local_38 ==
          (add_pointer_t<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>)
          0x0) {
        assn_00 = std::
                  get_if<std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::WATParser::Register,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                            ((variant<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
                              *)mod);
        if (assn_00 ==
            (add_pointer_t<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
             )0x0) {
          ::wasm::handle_unreachable
                    ("unexpected command",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                     ,0x5a);
        }
        doAssertion(__return_storage_ptr__,this,assn_00);
      }
      else {
        doAction(&local_78,this,local_38);
        std::
        variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>::
        ~variant(&local_78);
        ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,(Ok *)((long)&assn + 7));
      }
    }
    else {
      addRegistration(__return_storage_ptr__,this,(Register *)act);
    }
  }
  else {
    addModule(__return_storage_ptr__,this,(WASTModule *)reg);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> runCommand(WASTCommand& cmd) {
    if (auto* mod = std::get_if<WASTModule>(&cmd)) {
      return addModule(*mod);
    } else if (auto* reg = std::get_if<Register>(&cmd)) {
      return addRegistration(*reg);
    } else if (auto* act = std::get_if<Action>(&cmd)) {
      doAction(*act);
      return Ok{};
    } else if (auto* assn = std::get_if<Assertion>(&cmd)) {
      return doAssertion(*assn);
    } else {
      WASM_UNREACHABLE("unexpected command");
    }
  }